

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::setEncryptionParameters
          (QPDFWriter *this,char *user_password,char *owner_password,int V,int R,int key_len,
          set<int,_std::less<int>,_std::allocator<int>_> *bits_to_clear)

{
  string *id1;
  bool encrypt_metadata;
  element_type *peVar1;
  char *__s;
  QPDFWriter *pQVar2;
  _Rb_tree_node_base *p_Var3;
  uint uVar4;
  allocator<char> local_12d;
  int local_12c;
  char *local_128;
  char *local_120;
  QPDFWriter *local_118;
  string O;
  string U;
  string encryption_key;
  string Perms;
  string UE;
  string OE;
  string local_50;
  
  O._M_dataplus._M_p._0_4_ = 1;
  local_128 = owner_password;
  local_120 = user_password;
  local_118 = this;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&bits_to_clear->_M_t,(int *)&O);
  O._M_dataplus._M_p._0_4_ = 2;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&bits_to_clear->_M_t,(int *)&O);
  if (3 < R) {
    O._M_dataplus._M_p._0_4_ = 10;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&bits_to_clear->_M_t,(key_type *)&O);
  }
  uVar4 = 0;
  for (p_Var3 = (bits_to_clear->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pQVar2 = local_118,
      (_Rb_tree_header *)p_Var3 != &(bits_to_clear->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    uVar4 = uVar4 | 1 << ((byte)((char)p_Var3[1]._M_color - _S_black) & 0x1f);
  }
  uVar4 = ~uVar4;
  generateID(local_118);
  __s = local_120;
  O._M_dataplus._M_p = (pointer)&O.field_2;
  O._M_string_length = 0;
  O.field_2._M_local_buf[0] = '\0';
  U._M_dataplus._M_p = (pointer)&U.field_2;
  U._M_string_length = 0;
  OE._M_dataplus._M_p = (pointer)&OE.field_2;
  OE._M_string_length = 0;
  U.field_2._M_local_buf[0] = '\0';
  OE.field_2._M_local_buf[0] = '\0';
  UE._M_dataplus._M_p = (pointer)&UE.field_2;
  UE._M_string_length = 0;
  Perms._M_dataplus._M_p = (pointer)&Perms.field_2;
  Perms._M_string_length = 0;
  UE.field_2._M_local_buf[0] = '\0';
  Perms.field_2._M_local_buf[0] = '\0';
  encryption_key._M_dataplus._M_p = (pointer)&encryption_key.field_2;
  encryption_key._M_string_length = 0;
  encryption_key.field_2._M_local_buf[0] = '\0';
  peVar1 = (pQVar2->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  id1 = &peVar1->id1;
  encrypt_metadata = peVar1->encrypt_metadata;
  local_12c = V;
  if (V < 5) {
    QPDF::compute_encryption_O_U(local_120,local_128,V,R,key_len,uVar4,encrypt_metadata,id1,&O,&U);
  }
  else {
    QPDF::compute_encryption_parameters_V5
              (local_120,local_128,V,R,key_len,uVar4,encrypt_metadata,id1,&encryption_key,&O,&U,&OE,
               &UE,&Perms);
  }
  pQVar2 = local_118;
  peVar1 = (local_118->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_12d);
  setEncryptionParametersInternal
            (pQVar2,local_12c,R,key_len,uVar4,&O,&U,&OE,&UE,&Perms,&peVar1->id1,&local_50,
             &encryption_key);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&encryption_key);
  std::__cxx11::string::~string((string *)&Perms);
  std::__cxx11::string::~string((string *)&UE);
  std::__cxx11::string::~string((string *)&OE);
  std::__cxx11::string::~string((string *)&U);
  std::__cxx11::string::~string((string *)&O);
  return;
}

Assistant:

void
QPDFWriter::setEncryptionParameters(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    std::set<int>& bits_to_clear)
{
    // PDF specification refers to bits with the low bit numbered 1.
    // We have to convert this into a bit field.

    // Specification always requires bits 1 and 2 to be cleared.
    bits_to_clear.insert(1);
    bits_to_clear.insert(2);

    if (R > 3) {
        // Bit 10 is deprecated and should always be set.  This used to mean accessibility.  There
        // is no way to disable accessibility with R > 3.
        bits_to_clear.erase(10);
    }

    int P = 0;
    // Create the complement of P, then invert.
    for (int b: bits_to_clear) {
        P |= (1 << (b - 1));
    }
    P = ~P;

    generateID();
    std::string O;
    std::string U;
    std::string OE;
    std::string UE;
    std::string Perms;
    std::string encryption_key;
    if (V < 5) {
        QPDF::compute_encryption_O_U(
            user_password, owner_password, V, R, key_len, P, m->encrypt_metadata, m->id1, O, U);
    } else {
        QPDF::compute_encryption_parameters_V5(
            user_password,
            owner_password,
            V,
            R,
            key_len,
            P,
            m->encrypt_metadata,
            m->id1,
            encryption_key,
            O,
            U,
            OE,
            UE,
            Perms);
    }
    setEncryptionParametersInternal(
        V, R, key_len, P, O, U, OE, UE, Perms, m->id1, user_password, encryption_key);
}